

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::JUnitReporter::test_run_end(JUnitReporter *this,TestRunStats *p)

{
  bool bVar1;
  char *pcVar2;
  XmlWriter *pXVar3;
  vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
  *pvVar4;
  ScopedElement *this_00;
  ScopedElement *pSVar5;
  allocator local_3d1;
  string local_3d0 [39];
  allocator local_3a9;
  string local_3a8 [32];
  undefined1 local_388 [16];
  JUnitTestMessage *error;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
  *__range3_1;
  string local_358 [39];
  allocator local_331;
  string local_330 [39];
  allocator local_309;
  string local_308 [32];
  undefined1 local_2e8 [16];
  JUnitTestMessage *failure;
  const_iterator __end3;
  const_iterator __begin3;
  vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
  *__range3;
  string local_2b8 [39];
  allocator local_291;
  string local_290 [39];
  allocator local_269;
  string local_268 [39];
  allocator local_241;
  string local_240 [39];
  allocator local_219;
  string local_218 [32];
  reference local_1f8;
  JUnitTestCase *testCase;
  iterator __end2;
  iterator __begin2;
  vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
  *__range2;
  string local_1d0 [32];
  string local_1b0 [39];
  allocator local_189;
  string local_188 [39];
  allocator local_161;
  string local_160 [39];
  allocator local_139;
  string local_138 [39];
  allocator local_111;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [8];
  string binary_name;
  TestRunStats *p_local;
  JUnitReporter *this_local;
  
  pcVar2 = String::c_str(&this->opt->binary_name);
  pcVar2 = skipPathFromFilename(pcVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,pcVar2,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"testsuites",&local_71);
  XmlWriter::startElement(&this->xml,(string *)local_70);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"testsuite",&local_99);
  pXVar3 = XmlWriter::startElement(&this->xml,(string *)local_98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"name",&local_c1);
  pXVar3 = XmlWriter::writeAttribute(pXVar3,(string *)local_c0,(string *)local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"errors",&local_e9);
  pXVar3 = XmlWriter::writeAttribute<int>
                     (pXVar3,(string *)local_e8,&(this->testCaseData).totalErrors);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,"failures",&local_111);
  pXVar3 = XmlWriter::writeAttribute<int>
                     (pXVar3,(string *)local_110,&(this->testCaseData).totalFailures);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,"tests",&local_139);
  XmlWriter::writeAttribute<int>(pXVar3,(string *)local_138,&p->numAsserts);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  if ((this->opt->no_time_in_output & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_160,"time",&local_161);
    XmlWriter::writeAttribute<double>
              (&this->xml,(string *)local_160,&(this->testCaseData).totalSeconds);
    std::__cxx11::string::~string(local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_188,"timestamp",&local_189);
    (anonymous_namespace)::JUnitReporter::JUnitTestCaseData::getCurrentTimestamp_abi_cxx11_();
    XmlWriter::writeAttribute(&this->xml,(string *)local_188,local_1b0);
    std::__cxx11::string::~string((string *)local_1b0);
    std::__cxx11::string::~string(local_188);
    std::allocator<char>::~allocator((allocator<char> *)&local_189);
  }
  if ((this->opt->no_version & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d0,"doctest_version",(allocator *)((long)&__range2 + 7));
    XmlWriter::writeAttribute(&this->xml,(string *)local_1d0,"2.4.6");
    std::__cxx11::string::~string(local_1d0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
  }
  __end2 = std::
           vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
           ::begin(&(this->testCaseData).testcases);
  testCase = (JUnitTestCase *)
             std::
             vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
             ::end(&(this->testCaseData).testcases);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase_*,_std::vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>_>
                                *)&testCase);
    if (!bVar1) break;
    local_1f8 = __gnu_cxx::
                __normal_iterator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase_*,_std::vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>_>
                ::operator*(&__end2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_218,"testcase",&local_219);
    pXVar3 = XmlWriter::startElement(&this->xml,(string *)local_218);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_240,"classname",&local_241);
    pXVar3 = XmlWriter::writeAttribute(pXVar3,(string *)local_240,&local_1f8->classname);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_268,"name",&local_269);
    XmlWriter::writeAttribute(pXVar3,(string *)local_268,&local_1f8->name);
    std::__cxx11::string::~string(local_268);
    std::allocator<char>::~allocator((allocator<char> *)&local_269);
    std::__cxx11::string::~string(local_240);
    std::allocator<char>::~allocator((allocator<char> *)&local_241);
    std::__cxx11::string::~string(local_218);
    std::allocator<char>::~allocator((allocator<char> *)&local_219);
    if ((this->opt->no_time_in_output & 1U) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_290,"time",&local_291);
      XmlWriter::writeAttribute<double>(&this->xml,(string *)local_290,&local_1f8->time);
      std::__cxx11::string::~string(local_290);
      std::allocator<char>::~allocator((allocator<char> *)&local_291);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2b8,"status",(allocator *)((long)&__range3 + 7));
    XmlWriter::writeAttribute(&this->xml,(string *)local_2b8,"run");
    std::__cxx11::string::~string(local_2b8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
    pvVar4 = &local_1f8->failures;
    __end3 = std::
             vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
             ::begin(pvVar4);
    failure = (JUnitTestMessage *)
              std::
              vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
              ::end(pvVar4);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<const_doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage_*,_std::vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>_>
                                  *)&failure);
      if (!bVar1) break;
      local_2e8._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage_*,_std::vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>_>
           ::operator*(&__end3);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_308,"failure",&local_309);
      XmlWriter::scopedElement((XmlWriter *)local_2e8,(string *)&this->xml);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_330,"message",&local_331);
      this_00 = (ScopedElement *)
                (anonymous_namespace)::XmlWriter::ScopedElement::
                writeAttribute<std::__cxx11::string>
                          ((ScopedElement *)local_2e8,(string *)local_330,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2e8._8_8_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_358,"type",(allocator *)((long)&__range3_1 + 7));
      pSVar5 = (anonymous_namespace)::XmlWriter::ScopedElement::writeAttribute<std::__cxx11::string>
                         (this_00,(string *)local_358,(string *)(local_2e8._8_8_ + 0x20));
      XmlWriter::ScopedElement::writeText(pSVar5,(string *)(local_2e8._8_8_ + 0x40),false);
      std::__cxx11::string::~string(local_358);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range3_1 + 7));
      std::__cxx11::string::~string(local_330);
      std::allocator<char>::~allocator((allocator<char> *)&local_331);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_2e8);
      std::__cxx11::string::~string(local_308);
      std::allocator<char>::~allocator((allocator<char> *)&local_309);
      __gnu_cxx::
      __normal_iterator<const_doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage_*,_std::vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>_>
      ::operator++(&__end3);
    }
    pvVar4 = &local_1f8->errors;
    __end3_1 = std::
               vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
               ::begin(pvVar4);
    error = (JUnitTestMessage *)
            std::
            vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
            ::end(pvVar4);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end3_1,
                         (__normal_iterator<const_doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage_*,_std::vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>_>
                          *)&error);
      if (!bVar1) break;
      local_388._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage_*,_std::vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>_>
           ::operator*(&__end3_1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3a8,"error",&local_3a9);
      XmlWriter::scopedElement((XmlWriter *)local_388,(string *)&this->xml);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3d0,"message",&local_3d1);
      pSVar5 = (anonymous_namespace)::XmlWriter::ScopedElement::writeAttribute<std::__cxx11::string>
                         ((ScopedElement *)local_388,(string *)local_3d0,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_388._8_8_);
      XmlWriter::ScopedElement::writeText(pSVar5,(string *)(local_388._8_8_ + 0x40),true);
      std::__cxx11::string::~string(local_3d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_388);
      std::__cxx11::string::~string(local_3a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
      __gnu_cxx::
      __normal_iterator<const_doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage_*,_std::vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>_>
      ::operator++(&__end3_1);
    }
    XmlWriter::endElement(&this->xml);
    __gnu_cxx::
    __normal_iterator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase_*,_std::vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>_>
    ::operator++(&__end2);
  }
  XmlWriter::endElement(&this->xml);
  XmlWriter::endElement(&this->xml);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void test_run_end(const TestRunStats& p) override {
            // remove .exe extension - mainly to have the same output on UNIX and Windows
            std::string binary_name = skipPathFromFilename(opt.binary_name.c_str());
#ifdef DOCTEST_PLATFORM_WINDOWS
            if(binary_name.rfind(".exe") != std::string::npos)
                binary_name = binary_name.substr(0, binary_name.length() - 4);
#endif // DOCTEST_PLATFORM_WINDOWS
            xml.startElement("testsuites");
            xml.startElement("testsuite").writeAttribute("name", binary_name)
                    .writeAttribute("errors", testCaseData.totalErrors)
                    .writeAttribute("failures", testCaseData.totalFailures)
                    .writeAttribute("tests", p.numAsserts);
            if(opt.no_time_in_output == false) {
                xml.writeAttribute("time", testCaseData.totalSeconds);
                xml.writeAttribute("timestamp", JUnitTestCaseData::getCurrentTimestamp());
            }
            if(opt.no_version == false)
                xml.writeAttribute("doctest_version", DOCTEST_VERSION_STR);

            for(const auto& testCase : testCaseData.testcases) {
                xml.startElement("testcase")
                    .writeAttribute("classname", testCase.classname)
                    .writeAttribute("name", testCase.name);
                if(opt.no_time_in_output == false)
                    xml.writeAttribute("time", testCase.time);
                // This is not ideal, but it should be enough to mimic gtest's junit output.
                xml.writeAttribute("status", "run");

                for(const auto& failure : testCase.failures) {
                    xml.scopedElement("failure")
                        .writeAttribute("message", failure.message)
                        .writeAttribute("type", failure.type)
                        .writeText(failure.details, false);
                }

                for(const auto& error : testCase.errors) {
                    xml.scopedElement("error")
                        .writeAttribute("message", error.message)
                        .writeText(error.details);
                }

                xml.endElement();
            }
            xml.endElement();
            xml.endElement();
        }